

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreeVerifyConnections(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vBoxes)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int Counter;
  int iVar6;
  void *__s;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  size_t sVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int i;
  int iVar16;
  long lVar17;
  
  uVar1 = p->nObjs;
  uVar15 = (ulong)(int)uVar1;
  uVar10 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar10 = uVar1;
  }
  if ((uVar10 == 0) || (__s = malloc((long)(int)uVar10 << 2), __s == (void *)0x0)) {
    __s = (void *)0x0;
  }
  else {
    memset(__s,0xff,uVar15 * 4);
  }
  iVar6 = vBoxes->nSize;
  uVar7 = (ulong)iVar6;
  if (0 < (long)uVar7) {
    pVVar4 = vBoxes->pArray;
    uVar9 = 0;
    do {
      if (0 < pVVar4[uVar9].nSize) {
        piVar8 = pVVar4[uVar9].pArray;
        lVar12 = 0;
        do {
          iVar16 = piVar8[lVar12];
          if (iVar16 < 0) {
LAB_00686e49:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar10 = iVar16 * 6 + 3;
          iVar2 = vAdds->nSize;
          if (iVar2 <= (int)uVar10) goto LAB_00686e49;
          piVar5 = vAdds->pArray;
          iVar3 = piVar5[uVar10];
          if (((long)iVar3 < 0) || ((int)uVar1 <= iVar3)) {
LAB_00686e68:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)((long)__s + (long)iVar3 * 4) = 0;
          uVar10 = iVar16 * 6 + 4;
          if (iVar2 <= (int)uVar10) goto LAB_00686e49;
          uVar10 = piVar5[uVar10];
          if (((long)(int)uVar10 < 0) || (uVar1 <= uVar10)) goto LAB_00686e68;
          *(undefined4 *)((long)__s + (long)(int)uVar10 * 4) = 0;
          lVar12 = lVar12 + 1;
        } while (lVar12 < pVVar4[uVar9].nSize);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar7);
    if (0 < iVar6) {
      pVVar4 = vBoxes->pArray;
      uVar9 = 0;
      do {
        if (0 < pVVar4[uVar9].nSize) {
          piVar8 = pVVar4[uVar9].pArray;
          lVar12 = 0;
          do {
            iVar6 = piVar8[lVar12];
            lVar13 = (long)(iVar6 * 6);
            lVar14 = 3;
            do {
              if ((iVar6 < 0) || (vAdds->nSize <= lVar13)) goto LAB_00686e49;
              lVar17 = (long)vAdds->pArray[lVar13];
              if ((lVar17 < 0) || ((int)uVar1 <= vAdds->pArray[lVar13])) goto LAB_00686e49;
              iVar16 = *(int *)((long)__s + lVar17 * 4);
              if (iVar16 != -1) {
                *(int *)((long)__s + lVar17 * 4) = iVar16 + 1;
              }
              lVar13 = lVar13 + 1;
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar4[uVar9].nSize);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar7);
    }
  }
  if ((int)uVar1 < 1) {
    printf("The adder tree has %d internal cut points. ",0);
    puts("There is no internal fanouts.");
    if (__s == (void *)0x0) {
      return;
    }
  }
  else {
    uVar7 = 0;
    do {
      uVar7 = uVar7 + 1;
    } while (uVar15 != uVar7);
    uVar7 = 0;
    printf("The adder tree has %d internal cut points. ");
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)(1 < *(int *)((long)__s + uVar7 * 4));
      uVar7 = uVar7 + 1;
    } while (uVar15 != uVar7);
    if (iVar6 == 0) {
      puts("There is no internal fanouts.");
    }
    else {
      uVar7 = 0;
      do {
        uVar7 = uVar7 + 1;
      } while (uVar15 != uVar7);
      printf("These %d points have more than one fanout:\n");
      uVar7 = 0;
      do {
        uVar1 = *(uint *)((long)__s + uVar7 * 4);
        if (1 < (int)uVar1) {
          pVVar4 = p->vLevels;
          iVar6 = pVVar4->nSize;
          lVar12 = (long)iVar6;
          if (lVar12 <= (long)uVar7) {
            lVar13 = (long)pVVar4->nCap;
            uVar9 = lVar13 * 2;
            iVar16 = (int)(uVar7 + 1);
            if (SBORROW8(uVar7,uVar9) == (long)(uVar7 + lVar13 * -2) < 0) {
              sVar11 = (uVar7 + 1) * 4;
              if (pVVar4->pArray == (int *)0x0) {
                piVar8 = (int *)malloc(sVar11);
              }
              else {
                piVar8 = (int *)realloc(pVVar4->pArray,sVar11);
              }
              pVVar4->pArray = piVar8;
              iVar6 = iVar16;
joined_r0x00686d7e:
              if (piVar8 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar4->nCap = iVar6;
              iVar6 = pVVar4->nSize;
              lVar12 = (long)iVar6;
            }
            else if (lVar13 <= (long)uVar7) {
              sVar11 = (uVar9 & 0xffffffff) << 2;
              if (pVVar4->pArray == (int *)0x0) {
                piVar8 = (int *)malloc(sVar11);
              }
              else {
                piVar8 = (int *)realloc(pVVar4->pArray,sVar11);
              }
              pVVar4->pArray = piVar8;
              iVar6 = (int)uVar9;
              goto joined_r0x00686d7e;
            }
            if (lVar12 <= (long)uVar7) {
              memset(pVVar4->pArray + lVar12,0,(ulong)(uint)((int)uVar7 - iVar6) * 4 + 4);
            }
            pVVar4->nSize = iVar16;
          }
          printf("Node %d(lev %d) has fanout %d.\n",uVar7 & 0xffffffff,
                 (ulong)(uint)pVVar4->pArray[uVar7],(ulong)uVar1);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar15);
    }
  }
  free(__s);
  return;
}

Assistant:

void Acec_TreeVerifyConnections( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes )
{
    Vec_Int_t * vCounts = Vec_IntStartFull( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, n, Box;
    // mark outputs
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
        {
            Vec_IntWriteEntry( vCounts, Vec_IntEntry( vAdds, 6*Box+3 ), 0 );
            Vec_IntWriteEntry( vCounts, Vec_IntEntry( vAdds, 6*Box+4 ), 0 );
        }
    // count fanouts
    Vec_WecForEachLevel( vBoxes, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            for ( n = 0; n < 3; n++ )
                if ( Vec_IntEntry( vCounts, Vec_IntEntry(vAdds, 6*Box+n) ) != -1 )
                    Vec_IntAddToEntry( vCounts, Vec_IntEntry(vAdds, 6*Box+n), 1 );
    // print out
    printf( "The adder tree has %d internal cut points. ", Vec_IntCountLarger(vCounts, -1) );
    if ( Vec_IntCountLarger(vCounts, 1) == 0 )
        printf( "There is no internal fanouts.\n" );
    else
    {
        printf( "These %d points have more than one fanout:\n", Vec_IntCountLarger(vCounts, 1) );
        Vec_IntForEachEntry( vCounts, Box, i )
            if ( Box > 1 )
                printf( "Node %d(lev %d) has fanout %d.\n", i, Gia_ObjLevelId(p, i), Box );
    }
    Vec_IntFree( vCounts );
}